

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base32.h
# Opt level: O1

int base32_encode(uint8_t *data,int length,uint8_t *result,int bufSize)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  iVar3 = -1;
  if ((uint)length < 0x10000001) {
    uVar2 = 0;
    if (0 < bufSize && length != 0) {
      uVar6 = (uint)*data;
      iVar4 = 1;
      iVar3 = 8;
      uVar1 = 0;
      do {
        uVar2 = uVar1;
        if (length <= iVar4 && iVar3 < 1) break;
        if (iVar3 < 5) {
          if (iVar4 < length) {
            lVar5 = (long)iVar4;
            iVar4 = iVar4 + 1;
            uVar6 = uVar6 << 8 | (uint)data[lVar5];
            iVar3 = iVar3 + 8;
          }
          else {
            uVar6 = uVar6 << (5U - (char)iVar3 & 0x1f);
            iVar3 = 5;
          }
        }
        iVar3 = iVar3 + -5;
        result[uVar1] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[(int)uVar6 >> ((byte)iVar3 & 0x1f) & 0x1f];
        uVar1 = uVar1 + 1;
        uVar2 = (ulong)(uint)bufSize;
      } while ((uint)bufSize != uVar1);
    }
    iVar3 = (int)uVar2;
    if (iVar3 < bufSize) {
      result[uVar2 & 0xffffffff] = '\0';
    }
  }
  return iVar3;
}

Assistant:

int base32_encode(const uint8_t *data, int length, uint8_t *result, int bufSize) {
  if (length < 0 || length > (1 << 28)) {
    return -1;
  }
  int count = 0;
  if (length > 0) {
    int buffer = data[0];
    int next = 1;
    int bitsLeft = 8;
    while (count < bufSize && (bitsLeft > 0 || next < length)) {
      if (bitsLeft < 5) {
        if (next < length) {
          buffer <<= 8;
          buffer |= data[next++] & 0xFF;
          bitsLeft += 8;
        } else {
          int pad = 5 - bitsLeft;
          buffer <<= pad;
          bitsLeft += pad;
        }
      }
      int index = 0x1F & (buffer >> (bitsLeft - 5));
      bitsLeft -= 5;
      result[count++] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[index];
    }
  }
  if (count < bufSize) {
    result[count] = '\000';
  }
  return count;
}